

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O2

TestSuite * __thiscall
iutest::UnitTestImpl::AddTestSuite<iutest::TypedTestSuite<iutest::TemplateValue<0l>>>
          (UnitTestImpl *this,string *testsuite_name,TestTypeId id,SetUpMethod setup,
          TearDownMethod teardown)

{
  TypedTestSuite<iutest::TemplateValue<0L>_> *this_00;
  TypedTestSuite<iutest::TemplateValue<0L>_> *local_38;
  
  local_38 = (TypedTestSuite<iutest::TemplateValue<0L>_> *)FindTestSuite(this,testsuite_name,id);
  if (local_38 == (TypedTestSuite<iutest::TemplateValue<0L>_> *)0x0) {
    this_00 = (TypedTestSuite<iutest::TemplateValue<0L>_> *)operator_new(0xd0);
    TypedTestSuite<iutest::TemplateValue<0L>_>::TypedTestSuite
              (this_00,testsuite_name,id,setup,teardown);
    local_38 = this_00;
    std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::push_back
              (&this->m_testsuites,(value_type *)&local_38);
  }
  return &local_38->super_TestSuite;
}

Assistant:

TestSuite* AddTestSuite(const ::std::string& testsuite_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        TestSuite* p = FindTestSuite(testsuite_name, id);
        if( p == NULL )
        {
            p = new T (testsuite_name, id, setup, teardown);
            m_testsuites.push_back(p);
        }
        return p;
    }